

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void container_suite::test_assoc_array(void)

{
  value *pvVar1;
  value vVar2;
  value vVar3;
  value_type input [2];
  decoder decoder;
  value local_64 [2];
  uchar local_5a [2];
  decoder local_58;
  
  local_58.input._M_str = local_5a;
  local_5a[0] = 0x9e;
  local_5a[1] = 0x9f;
  local_58.input._M_len = 2;
  local_58.current.view._M_len = 0;
  local_58.current.view._M_str = (uchar *)0x0;
  local_58.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64[0] = local_58.current.code;
  pvVar1 = local_64 + 1;
  local_64[1] = 0x9e;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::begin_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3fb,"void container_suite::test_assoc_array()",local_64,pvVar1);
  local_64[0] = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_64[1] = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::begin_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3fc,"void container_suite::test_assoc_array()",local_64,pvVar1);
  vVar2 = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  vVar3 = end;
  local_64[0] = end;
  if (vVar2 - null < 0xc) {
    local_64[0] = *(value *)(&DAT_00124a00 + (ulong)(vVar2 - null) * 4);
  }
  local_64[1] = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::structural",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3fd,"void container_suite::test_assoc_array()",local_64,pvVar1);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64[0] = local_58.current.code;
  local_64[1] = 0x9f;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x3ff,"void container_suite::test_assoc_array()",local_64,pvVar1);
  local_64[0] = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_64[1] = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::end_assoc_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x400,"void container_suite::test_assoc_array()",local_64,pvVar1);
  vVar2 = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  if (vVar2 - null < 0xc) {
    vVar3 = *(value *)(&DAT_00124a00 + (ulong)(vVar2 - null) * 4);
  }
  local_64[1] = 3;
  local_64[0] = vVar3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::structural",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x401,"void container_suite::test_assoc_array()",local_64,pvVar1);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64[0] = local_58.current.code;
  local_64[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x403,"void container_suite::test_assoc_array()",local_64,pvVar1);
  return;
}

Assistant:

void test_assoc_array()
{
    const value_type input[] = { token::code::begin_assoc_array, token::code::end_assoc_array };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::begin_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::begin_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::structural);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::end_assoc_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::structural);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}